

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O2

void __thiscall
density_tests::
QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>
::ThreadData::handle_pending_put(ThreadData *this,size_t i_pending_put_index)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  int32_t iVar4;
  reentrant_put_transaction<void> *this_00;
  long lVar5;
  long lVar6;
  
  lVar6 = i_pending_put_index * 0x28;
  lVar5 = *(long *)(*(long *)(this + 0x13f0) + 0x20 + lVar6);
  this_00 = (reentrant_put_transaction<void> *)(*(long *)(this + 0x13f0) + lVar6);
  iVar4 = EasyRandom::get_bool((EasyRandom *)(this + 0x50));
  if (iVar4 == 0) {
    density::
    sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<void>::cancel(this_00);
  }
  else {
    density::
    sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<void>::commit(this_00);
    lVar5 = lVar5 * 0x10;
    plVar1 = (long *)(*(long *)(this + 0x20) + lVar5);
    lVar3 = plVar1[1];
    plVar2 = (long *)(*(long *)(this + 0x20) + lVar5);
    *plVar2 = *plVar1 + 1;
    plVar2[1] = lVar3 + 1;
    *(long *)(this + 0x13e0) = *(long *)(this + 0x13e0) + 1;
  }
  std::
  vector<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData::ReentrantPut,_std::allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData::ReentrantPut>_>
  ::erase((vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::ThreadData::ReentrantPut,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::ThreadData::ReentrantPut>_>
           *)(this + 0x13f0),(ReentrantPut *)(lVar6 + *(long *)(this + 0x13f0)));
  return;
}

Assistant:

void handle_pending_put(size_t const i_pending_put_index)
            {
                // commit or cancel a reentrant put
                auto &     pending_put = m_pending_reentrant_puts[i_pending_put_index];
                auto const type_index  = pending_put.m_type_index;
                if (m_random.get_bool())
                {
                    pending_put.m_transaction.commit();
                    m_final_stats.m_counters[type_index].m_existing++;
                    m_final_stats.m_counters[type_index].m_spawned++;
                    m_put_committed++;
                }
                else
                {
                    pending_put.m_transaction.cancel();
                }

                m_pending_reentrant_puts.erase(
                  m_pending_reentrant_puts.begin() + i_pending_put_index);
            }